

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

void openjtalk_speakAsync(OpenJTalk *oj,char *text)

{
  if (oj != (OpenJTalk *)0x0) {
    openjtalk_stop(oj);
    synthesis(oj,text);
    speakasync(oj);
    return;
  }
  g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_speakAsync(OpenJTalk *oj, const char *text)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}
	openjtalk_stop(oj);
	synthesisU8(oj, text);
	speakasync(oj);
}